

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

MetaDataFlags flagsFromStMode(mode_t mode,quint64 attributes)

{
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> QVar1;
  uint uVar2;
  
  QVar1.i = (mode & 0x100) * 0x40 + ((mode & 0xc0) << 6 | mode & 7) + (mode & 0x38) * 2 + 0x400000;
  uVar2 = mode & 0xf000;
  if ((short)uVar2 == 0x4000) {
    return (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
           (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)(QVar1.i | 0x40000);
  }
  if (uVar2 != 0x6000) {
    if (uVar2 == 0x8000) {
      return (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
             (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)(QVar1.i | 0x20000);
    }
    QVar1.i = QVar1.i | 0x800000;
  }
  return (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)QVar1.i;
}

Assistant:

static QFileSystemMetaData::MetaDataFlags
flagsFromStMode(mode_t mode, [[maybe_unused]] quint64 attributes)
{
    // inode exists
    QFileSystemMetaData::MetaDataFlags entryFlags = QFileSystemMetaData::ExistsAttribute;

    if (mode & S_IRUSR)
        entryFlags |= QFileSystemMetaData::OwnerReadPermission;
    if (mode & S_IWUSR)
        entryFlags |= QFileSystemMetaData::OwnerWritePermission;
    if (mode & S_IXUSR)
        entryFlags |= QFileSystemMetaData::OwnerExecutePermission;

    if (mode & S_IRGRP)
        entryFlags |= QFileSystemMetaData::GroupReadPermission;
    if (mode & S_IWGRP)
        entryFlags |= QFileSystemMetaData::GroupWritePermission;
    if (mode & S_IXGRP)
        entryFlags |= QFileSystemMetaData::GroupExecutePermission;

    if (mode & S_IROTH)
        entryFlags |= QFileSystemMetaData::OtherReadPermission;
    if (mode & S_IWOTH)
        entryFlags |= QFileSystemMetaData::OtherWritePermission;
    if (mode & S_IXOTH)
        entryFlags |= QFileSystemMetaData::OtherExecutePermission;

    // Type
    Q_ASSERT(!S_ISLNK(mode));   // can only happen with lstat()
    if ((mode & S_IFMT) == S_IFREG)
        entryFlags |= QFileSystemMetaData::FileType;
    else if ((mode & S_IFMT) == S_IFDIR)
        entryFlags |= QFileSystemMetaData::DirectoryType;
    else if ((mode & S_IFMT) != S_IFBLK)    // char devices, sockets, FIFOs
        entryFlags |= QFileSystemMetaData::SequentialType;

    // OS-specific flags
    // Potential flags for the future:
    // UF_APPEND and STATX_ATTR_APPEND
    // UF_COMPRESSED and STATX_ATTR_COMPRESSED
    // UF_IMMUTABLE and STATX_ATTR_IMMUTABLE
    // UF_NODUMP and STATX_ATTR_NODUMP
#ifdef UF_HIDDEN
    if (attributes & UF_HIDDEN)
        entryFlags |= QFileSystemMetaData::HiddenAttribute;
#elif defined(Q_OS_VXWORKS) && __has_include(<dosFsLib.h>)
    if (attributes & DOS_ATTR_RDONLY) {
        // on a DOS FS, stat() always returns 0777 bits set in st_mode
        // when DOS FS is read only the write permissions are removed
        entryFlags &= ~QFileSystemMetaData::OwnerWritePermission;
        entryFlags &= ~QFileSystemMetaData::GroupWritePermission;
        entryFlags &= ~QFileSystemMetaData::OtherWritePermission;
    }
#endif
    return entryFlags;
}